

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sse_avx2.c
# Opt level: O0

void highbd_sse_w4x4_avx2(__m256i *sum,uint16_t *a,int a_stride,uint16_t *b,int b_stride)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  void *in_RCX;
  long lVar9;
  int in_EDX;
  longlong extraout_RDX;
  void *in_RSI;
  void *pvVar10;
  undefined1 (*in_RDI) [32];
  __m256i *__return_storage_ptr__;
  int iVar11;
  longlong in_R8;
  undefined8 in_XMM0_Qa;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 in_XMM0_Qb;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  __m128i alVar28;
  __m128i hi;
  __m128i lo;
  __m128i lo_00;
  __m256i v_d_w;
  __m256i v_b_w;
  __m256i v_a_w;
  __m128i v_b3;
  __m128i v_b2;
  __m128i v_b1;
  __m128i v_b0;
  __m128i v_a3;
  __m128i v_a2;
  __m128i v_a1;
  __m128i v_a0;
  
  iVar11 = (int)in_R8;
  pvVar10 = in_RSI;
  xx_loadl_64(in_RSI);
  uVar12 = in_XMM0_Qa;
  uVar21 = in_XMM0_Qb;
  xx_loadl_64((void *)((long)in_RSI + (long)in_EDX * 2));
  uVar13 = uVar12;
  uVar22 = uVar21;
  xx_loadl_64((void *)((long)in_RSI + (long)(in_EDX * 2) * 2));
  uVar14 = uVar13;
  uVar23 = uVar22;
  xx_loadl_64((void *)((long)in_RSI + (long)(in_EDX * 3) * 2));
  uVar15 = uVar14;
  uVar24 = uVar23;
  xx_loadl_64(in_RCX);
  uVar16 = uVar15;
  uVar25 = uVar24;
  xx_loadl_64((void *)((long)in_RCX + (long)iVar11 * 2));
  uVar17 = uVar16;
  uVar26 = uVar25;
  xx_loadl_64((void *)((long)in_RCX + (long)(iVar11 * 2) * 2));
  lVar9 = (long)(iVar11 * 3);
  __return_storage_ptr__ = (__m256i *)((long)in_RCX + lVar9 * 2);
  uVar18 = uVar17;
  uVar27 = uVar26;
  alVar28 = xx_loadl_64(__return_storage_ptr__);
  auVar8._8_8_ = in_XMM0_Qb;
  auVar8._0_8_ = in_XMM0_Qa;
  auVar7._8_8_ = uVar21;
  auVar7._0_8_ = uVar12;
  auVar1 = vpunpcklqdq_avx(auVar8,auVar7);
  auVar19 = ZEXT1632(auVar1);
  auVar6._8_8_ = uVar22;
  auVar6._0_8_ = uVar13;
  auVar5._8_8_ = uVar23;
  auVar5._0_8_ = uVar14;
  vpunpcklqdq_avx(auVar6,auVar5);
  alVar28[0] = (longlong)pvVar10;
  lo[1] = in_R8;
  lo[0] = lVar9;
  yy_set_m128i(__return_storage_ptr__,alVar28,lo);
  auVar4._8_8_ = uVar24;
  auVar4._0_8_ = uVar15;
  auVar3._8_8_ = uVar25;
  auVar3._0_8_ = uVar16;
  auVar1 = vpunpcklqdq_avx(auVar4,auVar3);
  auVar20 = ZEXT1632(auVar1);
  auVar2._8_8_ = uVar26;
  auVar2._0_8_ = uVar17;
  auVar1._8_8_ = uVar27;
  auVar1._0_8_ = uVar18;
  vpunpcklqdq_avx(auVar2,auVar1);
  hi[1] = extraout_RDX;
  hi[0] = (longlong)pvVar10;
  lo_00[1] = in_R8;
  lo_00[0] = lVar9;
  yy_set_m128i(__return_storage_ptr__,hi,lo_00);
  auVar19 = vpsubw_avx2(auVar19,auVar20);
  auVar19 = vpmaddwd_avx2(auVar19,auVar19);
  auVar19 = vpaddd_avx2(*in_RDI,auVar19);
  *in_RDI = auVar19;
  return;
}

Assistant:

static inline void highbd_sse_w4x4_avx2(__m256i *sum, const uint16_t *a,
                                        int a_stride, const uint16_t *b,
                                        int b_stride) {
  const __m128i v_a0 = xx_loadl_64(a);
  const __m128i v_a1 = xx_loadl_64(a + a_stride);
  const __m128i v_a2 = xx_loadl_64(a + a_stride * 2);
  const __m128i v_a3 = xx_loadl_64(a + a_stride * 3);
  const __m128i v_b0 = xx_loadl_64(b);
  const __m128i v_b1 = xx_loadl_64(b + b_stride);
  const __m128i v_b2 = xx_loadl_64(b + b_stride * 2);
  const __m128i v_b3 = xx_loadl_64(b + b_stride * 3);
  const __m256i v_a_w = yy_set_m128i(_mm_unpacklo_epi64(v_a0, v_a1),
                                     _mm_unpacklo_epi64(v_a2, v_a3));
  const __m256i v_b_w = yy_set_m128i(_mm_unpacklo_epi64(v_b0, v_b1),
                                     _mm_unpacklo_epi64(v_b2, v_b3));
  const __m256i v_d_w = _mm256_sub_epi16(v_a_w, v_b_w);
  *sum = _mm256_add_epi32(*sum, _mm256_madd_epi16(v_d_w, v_d_w));
}